

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileScript(jx9_vm *pVm,SyString *pScript,sxi32 iFlags)

{
  undefined1 local_58 [4];
  sxi32 rc;
  SySet aToken;
  jx9_gen_state *pGen;
  sxi32 iFlags_local;
  SyString *pScript_local;
  jx9_vm *pVm_local;
  
  if (pScript->nByte == 0) {
    pVm_local._4_4_ = 0;
  }
  else {
    SySetInit((SySet *)local_58,&pVm->sAllocator,0x20);
    SySetAlloc((SySet *)local_58,0xc0);
    aToken.pUserData = &pVm->sCodeGen;
    jx9Tokenize(pScript->zString,pScript->nByte,(SySet *)local_58);
    if ((uint)aToken.pBase == 0) {
      pVm_local._4_4_ = -3;
    }
    else {
      *(SyMemBackend **)((long)aToken.pUserData + 0x158) = aToken.pAllocator;
      *(ulong *)((long)aToken.pUserData + 0x160) =
           *(long *)((long)aToken.pUserData + 0x158) + (ulong)(uint)aToken.pBase * 0x20;
      pVm_local._4_4_ = GenStateCompileChunk((jx9_gen_state *)aToken.pUserData,iFlags);
      SySetRelease((SySet *)local_58);
    }
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileScript(
	jx9_vm *pVm,        /* Generate JX9 bytecodes for this Virtual Machine */
	SyString *pScript,  /* Script to compile */
	sxi32 iFlags        /* Compile flags */
	)
{
	jx9_gen_state *pGen;
	SySet aToken;
	sxi32 rc;
	if( pScript->nByte < 1 ){
		/* Nothing to compile */
		return JX9_OK;
	}
	/* Initialize the tokens containers */
	SySetInit(&aToken, &pVm->sAllocator, sizeof(SyToken));
	SySetAlloc(&aToken, 0xc0);
	pGen = &pVm->sCodeGen;
	rc = JX9_OK;
	/* Tokenize the JX9 chunk first */
	jx9Tokenize(pScript->zString,pScript->nByte,&aToken);
	if( SySetUsed(&aToken) < 1 ){
		return SXERR_EMPTY;
	}
	/* Point to the head and tail of the token stream. */
	pGen->pIn  = (SyToken *)SySetBasePtr(&aToken);
	pGen->pEnd = &pGen->pIn[SySetUsed(&aToken)];
	/* Compile the chunk */
	rc = GenStateCompileChunk(pGen,iFlags);
	/* Cleanup */
	SySetRelease(&aToken);
	return rc;
}